

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_regexp_Symbol_match(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSShape *sh;
  int iVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  JSValueUnion JVar6;
  int64_t iVar7;
  ulong uVar8;
  bool bVar9;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSValue this_obj;
  JSValue v_03;
  JSValue JVar10;
  JSValue JVar11;
  JSValue JVar12;
  JSValue s;
  JSValue val;
  int64_t thisIndex;
  JSValueUnion local_80;
  JSValueUnion local_78;
  JSValueUnion local_70;
  int64_t local_68;
  JSValueUnion local_60;
  long local_58;
  int local_4c;
  int64_t local_48;
  JSValueUnion local_40;
  JSValueUnion local_38;
  int64_t iVar5;
  
  if ((int)this_val.tag == -1) {
    JVar10 = JS_ToStringInternal(ctx,*argv,0);
    iVar5 = JVar10.tag;
    local_60 = JVar10.u;
    local_38 = local_60;
    if ((int)JVar10.tag == 6) {
LAB_00142096:
      uVar8 = 0;
      uVar4 = 0;
      this_obj.tag = 3;
      JVar10 = (JSValue)(ZEXT816(3) << 0x40);
    }
    else {
      JVar10 = JS_GetPropertyInternal(ctx,this_val,0x6e,this_val,0);
      iVar1 = JS_ToBoolFree(ctx,JVar10);
      if (-1 < iVar1) {
        if (iVar1 == 0) {
          JVar10.tag = iVar5;
          JVar10.u.ptr = local_60.ptr;
          JVar12 = JS_RegExpExec(ctx,this_val,JVar10);
          uVar8 = (ulong)JVar12.u.ptr >> 0x20;
          JVar10 = (JSValue)(ZEXT816(3) << 0x40);
LAB_00142292:
          this_obj.tag = JVar12.tag;
          local_80 = JVar10.u;
          if ((0xfffffff4 < (uint)JVar10.tag) &&
             (iVar1 = *local_80.ptr, *(int *)local_80.ptr = iVar1 + -1, iVar1 < 2)) {
            __JS_FreeValueRT(ctx->rt,JVar10);
          }
          local_80.float64 = local_60.float64;
          if ((0xfffffff4 < (uint)iVar5) &&
             (iVar1 = *local_60.ptr, *(int *)local_60.ptr = iVar1 + -1, iVar1 < 2)) {
            v_01.tag = iVar5;
            v_01.u.ptr = local_60.ptr;
            __JS_FreeValueRT(ctx->rt,v_01);
          }
          uVar8 = uVar8 << 0x20;
          uVar3 = (ulong)JVar12.u.ptr & 0xffffffff;
          goto LAB_0014224f;
        }
        JVar10 = JS_GetPropertyInternal(ctx,this_val,0x6f,this_val,0);
        iVar1 = JS_ToBoolFree(ctx,JVar10);
        if (-1 < iVar1) {
          iVar2 = JS_SetPropertyInternal(ctx,this_val,0x55,(JSValue)ZEXT816(0),0x4000);
          if (-1 < iVar2) {
            sh = ctx->array_shape;
            (sh->header).ref_count = (sh->header).ref_count + 1;
            local_4c = iVar1;
            JVar10 = JS_NewObjectFromShape(ctx,sh,2);
            this_obj.tag = JVar10.tag;
            local_78 = JVar10.u;
            uVar8 = (ulong)local_78.ptr >> 0x20;
            if ((int)JVar10.tag != 6) {
              local_40 = local_38;
              local_58 = 0;
              local_80.float64 = 0.0;
              iVar7 = 3;
              local_48 = iVar5;
              do {
                if ((0xfffffff4 < (uint)iVar7) &&
                   (iVar1 = *local_80.ptr, *(int *)local_80.ptr = iVar1 + -1, iVar1 < 2)) {
                  v_02.tag = iVar7;
                  v_02.u.ptr = local_80.ptr;
                  __JS_FreeValueRT(ctx->rt,v_02);
                }
                s.tag = iVar5;
                s.u.ptr = local_60.ptr;
                JVar10 = JS_RegExpExec(ctx,this_val,s);
                if ((int)JVar10.tag == 2) {
                  if (local_58 == 0) {
                    v_03.tag = this_obj.tag;
                    v_03.u.float64 = local_78.float64;
                    JS_FreeValue(ctx,v_03);
                    JVar12 = (JSValue)(ZEXT816(2) << 0x40);
                    uVar8 = 0;
                  }
                  else {
                    JVar12.tag = this_obj.tag;
                    JVar12.u.float64 = local_78.float64;
                  }
                  goto LAB_00142292;
                }
                if ((int)JVar10.tag == 6) goto LAB_00142188;
                _local_70 = JVar10;
                JVar10 = JS_GetPropertyValue(ctx,JVar10,(JSValue)ZEXT816(0));
                JVar10 = JS_ToStringFree(ctx,JVar10);
                local_80 = JVar10.u;
                if ((JVar10.tag & 0xffffffffU) == 6) goto LAB_001424c7;
                bVar9 = true;
                if ((int)JVar10.tag == -7) {
                  bVar9 = (*(uint *)((long)local_80.ptr + 4) & 0x7fffffff) != 0;
                }
                this_obj.u.float64 = local_78.float64;
                iVar1 = JS_SetPropertyInt64(ctx,this_obj,local_58,JVar10);
                iVar5 = local_48;
                if (iVar1 < 0) goto LAB_001424c7;
                if (!bVar9) {
                  JVar10 = JS_GetPropertyInternal(ctx,this_val,0x55,this_val,0);
                  iVar1 = JS_ToLengthFree(ctx,(int64_t *)&local_80.int32,JVar10);
                  if (iVar1 < 0) goto LAB_001424c7;
                  uVar3 = string_advance_index((JSString *)local_40.ptr,(int64_t)local_80,local_4c);
                  bVar9 = (long)(int)uVar3 == uVar3;
                  JVar6.float64 = (double)(long)uVar3;
                  if (bVar9) {
                    JVar6.ptr = (void *)(uVar3 & 0xffffffff);
                  }
                  iVar7 = 7;
                  if (bVar9) {
                    iVar7 = 0;
                  }
                  val.tag = iVar7;
                  val.u.float64 = JVar6.float64;
                  iVar1 = JS_SetPropertyInternal(ctx,this_val,0x55,val,0x4000);
                  if (iVar1 < 0) goto LAB_001424c7;
                }
                local_58 = local_58 + 1;
                local_80 = local_70;
                iVar7 = local_68;
              } while( true );
            }
            JVar10 = (JSValue)(ZEXT816(3) << 0x40);
LAB_00142188:
            uVar4 = local_78.int32;
            goto LAB_001421a2;
          }
          goto LAB_00142096;
        }
      }
      this_obj.tag = 3;
      uVar4 = 0;
      uVar8 = 0;
      JVar10 = (JSValue)(ZEXT816(3) << 0x40);
    }
    goto LAB_001421a2;
  }
  JS_ThrowTypeError(ctx,"not an object");
  goto LAB_0014224c;
LAB_001424c7:
  uVar4 = local_78.int32;
  JVar10 = _local_70;
LAB_001421a2:
  local_80.ptr = (void *)((ulong)uVar4 | uVar8 << 0x20);
  if ((0xfffffff4 < (uint)this_obj.tag) &&
     (iVar1 = *local_80.ptr, *(int *)local_80.ptr = iVar1 + -1, iVar1 < 2)) {
    v.tag = this_obj.tag;
    v.u.ptr = local_80.ptr;
    __JS_FreeValueRT(ctx->rt,v);
  }
  local_80 = JVar10.u;
  if ((0xfffffff4 < (uint)JVar10.tag) &&
     (iVar1 = *local_80.ptr, *(int *)local_80.ptr = iVar1 + -1, iVar1 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar10);
  }
  local_80.float64 = local_60.float64;
  if ((0xfffffff4 < (uint)iVar5) &&
     (iVar1 = *local_60.ptr, *(int *)local_60.ptr = iVar1 + -1, iVar1 < 2)) {
    v_00.tag = iVar5;
    v_00.u.ptr = local_60.ptr;
    __JS_FreeValueRT(ctx->rt,v_00);
  }
LAB_0014224c:
  uVar3 = 0;
  this_obj.tag = 6;
  uVar8 = 0;
LAB_0014224f:
  JVar11.tag = this_obj.tag;
  JVar11.u.ptr = (void *)(uVar3 | uVar8);
  return JVar11;
}

Assistant:

static JSValue js_regexp_Symbol_match(JSContext *ctx, JSValueConst this_val,
                                      int argc, JSValueConst *argv)
{
    // [Symbol.match](str)
    JSValueConst rx = this_val;
    JSValue A, S, result, matchStr;
    int global, n, fullUnicode, isEmpty;
    JSString *p;

    if (!JS_IsObject(rx))
        return JS_ThrowTypeErrorNotAnObject(ctx);

    A = JS_UNDEFINED;
    result = JS_UNDEFINED;
    matchStr = JS_UNDEFINED;
    S = JS_ToString(ctx, argv[0]);
    if (JS_IsException(S))
        goto exception;

    global = JS_ToBoolFree(ctx, JS_GetProperty(ctx, rx, JS_ATOM_global));
    if (global < 0)
        goto exception;

    if (!global) {
        A = JS_RegExpExec(ctx, rx, S);
    } else {
        fullUnicode = JS_ToBoolFree(ctx, JS_GetProperty(ctx, rx, JS_ATOM_unicode));
        if (fullUnicode < 0)
            goto exception;

        if (JS_SetProperty(ctx, rx, JS_ATOM_lastIndex, JS_NewInt32(ctx, 0)) < 0)
            goto exception;
        A = JS_NewArray(ctx);
        if (JS_IsException(A))
            goto exception;
        n = 0;
        for(;;) {
            JS_FreeValue(ctx, result);
            result = JS_RegExpExec(ctx, rx, S);
            if (JS_IsException(result))
                goto exception;
            if (JS_IsNull(result))
                break;
            matchStr = JS_ToStringFree(ctx, JS_GetPropertyInt64(ctx, result, 0));
            if (JS_IsException(matchStr))
                goto exception;
            isEmpty = JS_IsEmptyString(matchStr);
            if (JS_SetPropertyInt64(ctx, A, n++, matchStr) < 0)
                goto exception;
            if (isEmpty) {
                int64_t thisIndex, nextIndex;
                if (JS_ToLengthFree(ctx, &thisIndex,
                                    JS_GetProperty(ctx, rx, JS_ATOM_lastIndex)) < 0)
                    goto exception;
                p = JS_VALUE_GET_STRING(S);
                nextIndex = string_advance_index(p, thisIndex, fullUnicode);
                if (JS_SetProperty(ctx, rx, JS_ATOM_lastIndex, JS_NewInt64(ctx, nextIndex)) < 0)
                    goto exception;
            }
        }
        if (n == 0) {
            JS_FreeValue(ctx, A);
            A = JS_NULL;
        }
    }
    JS_FreeValue(ctx, result);
    JS_FreeValue(ctx, S);
    return A;

exception:
    JS_FreeValue(ctx, A);
    JS_FreeValue(ctx, result);
    JS_FreeValue(ctx, S);
    return JS_EXCEPTION;
}